

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cmds.cpp
# Opt level: O0

void Cmd_myinfo(FCommandLine *argv,APlayerPawn *who,int key)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  MetaClass *pMVar4;
  char *pcVar5;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  bVar2 = CheckCheatmode(true);
  if ((!bVar2) && ((&players)[(long)consoleplayer * 0x54] != 0)) {
    pMVar4 = APlayerPawn::GetClass((APlayerPawn *)(&players)[(long)consoleplayer * 0x54]);
    pcVar5 = FName::GetChars(&(pMVar4->super_PClassActor).super_PClass.super_PNativeStruct.
                              super_PStruct.super_PNamedType.TypeName);
    uVar1 = *(uint *)((&players)[(long)consoleplayer * 0x54] + 0x1fc);
    uVar3 = AActor::SpawnHealth((AActor *)(&players)[(long)consoleplayer * 0x54]);
    Printf("Target=%s, Health=%d, Spawnhealth=%d\n",pcVar5,(ulong)uVar1,(ulong)uVar3);
    PrintMiscActorInfo((AActor *)(&players)[(long)consoleplayer * 0x54]);
  }
  return;
}

Assistant:

CCMD(myinfo)
{
	if (CheckCheatmode () || players[consoleplayer].mo == NULL) return;
	Printf("Target=%s, Health=%d, Spawnhealth=%d\n",
		players[consoleplayer].mo->GetClass()->TypeName.GetChars(),
		players[consoleplayer].mo->health,
		players[consoleplayer].mo->SpawnHealth());
	PrintMiscActorInfo(players[consoleplayer].mo);
}